

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPolComponent_VectorImplementation.cpp
# Opt level: O0

Index __thiscall
JPolComponent_VectorImplementation::GetJointActionIndex
          (JPolComponent_VectorImplementation *this,Index jdI)

{
  uint uVar1;
  int iVar2;
  Interface_ProblemToPolicyDiscretePure *pIVar3;
  undefined4 extraout_var;
  ulong uVar4;
  const_reference pvVar5;
  undefined4 extraout_var_00;
  size_type sVar6;
  ostream *poVar7;
  undefined8 uVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  reference pvVar9;
  const_reference ppPVar10;
  uint in_ESI;
  long in_RDI;
  Index agentI_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> individualActionIndices;
  stringstream ss;
  size_t nrA;
  vector<unsigned_int,_std::allocator<unsigned_int>_> individualDomainIndices_1;
  Index agentI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *individualDomainIndices;
  Index ja_i;
  Index aThisAgent;
  Index ohI;
  JPolComponent_VectorImplementation *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  value_type in_stack_fffffffffffffd90;
  value_type in_stack_fffffffffffffd94;
  size_type in_stack_fffffffffffffd98;
  uint local_200;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f8;
  stringstream local_1e0 [16];
  ostream local_1d0 [392];
  size_type local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  uint local_24;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_20;
  Index local_18;
  value_type local_14;
  uint local_10;
  uint local_c;
  
  local_c = in_ESI;
  pIVar3 = GetInterfacePTPDiscretePure(in_stack_fffffffffffffd78);
  uVar1 = (*(pIVar3->super_Interface_ProblemToPolicyDiscrete).
            _vptr_Interface_ProblemToPolicyDiscrete[2])(pIVar3,(ulong)*(uint *)(in_RDI + 0x28));
  if ((uVar1 & 1) == 0) {
    pIVar3 = GetInterfacePTPDiscretePure(in_stack_fffffffffffffd78);
    (*(pIVar3->super_Interface_ProblemToPolicyDiscrete)._vptr_Interface_ProblemToPolicyDiscrete[9])
              (&local_40,pIVar3,(ulong)local_c,(ulong)*(uint *)(in_RDI + 0x28));
    pIVar3 = GetInterfacePTPDiscretePure(in_stack_fffffffffffffd78);
    iVar2 = (*(pIVar3->super_Interface_ProblemToPolicyDiscrete).
              _vptr_Interface_ProblemToPolicyDiscrete[3])();
    local_48 = CONCAT44(extraout_var_00,iVar2);
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_40);
    if (sVar6 != local_48) {
      std::__cxx11::stringstream::stringstream(local_1e0);
      poVar7 = std::operator<<(local_1d0,
                               " JPolComponent_VectorImplementation::GetJointActionIndex Dimension "
                              );
      poVar7 = std::operator<<(poVar7,"mismatch, jdI has ");
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_40);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar6);
      poVar7 = std::operator<<(poVar7,"individual actions, but there are ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_48);
      std::operator<<(poVar7," agents!\n");
      uVar8 = __cxa_allocate_exception(0x28);
      E::E((E *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
           (stringstream *)in_stack_fffffffffffffd78);
      __cxa_throw(uVar8,&E::typeinfo,E::~E);
    }
    this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_40);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x988b23);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (this_00,in_stack_fffffffffffffd98,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x988b49);
    local_200 = 0;
    while( true ) {
      uVar4 = (ulong)local_200;
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_40);
      if (sVar6 <= uVar4) break;
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_40,(ulong)local_200);
      local_10 = *pvVar9;
      ppPVar10 = std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::operator[]
                           ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)
                            (in_RDI + 0x30),(ulong)local_200);
      in_stack_fffffffffffffd90 =
           (*((*ppPVar10)->super_PolicyDiscretePure).super_PolicyDiscrete.super_Policy._vptr_Policy
             [8])(*ppPVar10,(ulong)local_10);
      in_stack_fffffffffffffd94 = in_stack_fffffffffffffd90;
      local_14 = in_stack_fffffffffffffd90;
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_1f8,(ulong)local_200);
      *pvVar9 = in_stack_fffffffffffffd90;
      local_200 = local_200 + 1;
    }
    pIVar3 = GetInterfacePTPDiscretePure(in_stack_fffffffffffffd78);
    local_18 = (*(pIVar3->super_Interface_ProblemToPolicyDiscrete).
                 _vptr_Interface_ProblemToPolicyDiscrete[7])(pIVar3,&local_1f8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  }
  else {
    pIVar3 = GetInterfacePTPDiscretePure(in_stack_fffffffffffffd78);
    iVar2 = (*(pIVar3->super_Interface_ProblemToPolicyDiscrete).
              _vptr_Interface_ProblemToPolicyDiscrete[10])
                      (pIVar3,(ulong)local_c,(ulong)*(uint *)(in_RDI + 0x28));
    local_20 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(extraout_var,iVar2);
    local_24 = 0;
    while( true ) {
      uVar4 = (ulong)local_24;
      sVar6 = std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::size
                        ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)
                         (in_RDI + 0x30));
      if (sVar6 <= uVar4) break;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_20,(ulong)local_24);
      local_10 = *pvVar5;
      ppPVar10 = std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::operator[]
                           ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)
                            (in_RDI + 0x30),(ulong)local_24);
      local_14 = (*((*ppPVar10)->super_PolicyDiscretePure).super_PolicyDiscrete.super_Policy.
                   _vptr_Policy[8])(*ppPVar10,(ulong)local_10);
      *(value_type *)(*(long *)(in_RDI + 8) + (ulong)local_24 * 4) = local_14;
      local_24 = local_24 + 1;
    }
    pIVar3 = GetInterfacePTPDiscretePure(in_stack_fffffffffffffd78);
    local_18 = (*(pIVar3->super_Interface_ProblemToPolicyDiscrete).
                 _vptr_Interface_ProblemToPolicyDiscrete[6])(pIVar3,*(undefined8 *)(in_RDI + 8));
  }
  return local_18;
}

Assistant:

Index JPolComponent_VectorImplementation::GetJointActionIndex(Index jdI) const
{
    Index ohI, aThisAgent, ja_i;

    // it is possible to cache the joint->individual observ. history mapping
    // If this is done we want to use it by calling 
    //    JointToIndividualObservationHistoryIndicesRef
    // as it is faster.
    // Otherwise we have to use 
    //    JointToIndividualObservationHistoryIndices
    // to avoid a segfault.
    //
    // The mentioned cache is calculated, when generating joint observation
    // histories. This is controlled by the 
    // PlanningUnitMADPDiscreteParameters of the PlanningUnitMADPDiscrete.
    // ( _m_params.GetComputeJointObservationHistories() in particular )

    //if the "Interface_ProblemToPolicyDiscretePure"-implementing object this
    //policy caches joint -> indiv OH indices
    if(GetInterfacePTPDiscretePure()->AreCachedJointToIndivIndices(_m_idc ) )
    {
        const vector<Index> &individualDomainIndices = GetInterfacePTPDiscretePure()->
            JointToIndividualPolicyDomainIndicesRef(jdI, _m_idc );

        //vector<Index> individualActionIndices(individualDomainIndices.size());
        for( Index agentI=0; agentI < _m_indivPols_PolicyPureVector.size() ;  agentI++ )
        {
            ohI=individualDomainIndices[agentI];
            aThisAgent = _m_indivPols_PolicyPureVector[agentI]->
                GetActionIndex(ohI);

            _m_indivActionIndices[agentI]=aThisAgent;
        }
        ja_i = GetInterfacePTPDiscretePure()->IndividualToJointActionIndices(_m_indivActionIndices);
    } 
    else 
    { 
        vector<Index> individualDomainIndices = GetInterfacePTPDiscretePure()->
            JointToIndividualPolicyDomainIndices(jdI,_m_idc);

        size_t nrA = GetInterfacePTPDiscretePure()->GetNrAgents(); 
        if( individualDomainIndices.size() !=
            static_cast<vector<Index>::size_type>(nrA)   ) 
        {
            stringstream ss; 
            ss<<" JPolComponent_VectorImplementation::GetJointActionIndex Dimension "<<
                "mismatch, jdI has " << individualDomainIndices.size() <<
                "individual actions, but there are "<< nrA <<" agents!\n"; 
            throw E(ss); 
        }

        vector<Index> individualActionIndices(individualDomainIndices.size());
        for( Index agentI=0; agentI < individualDomainIndices.size();
             ++agentI )
        {
            ohI=individualDomainIndices[agentI];
            aThisAgent = _m_indivPols_PolicyPureVector[agentI]->GetActionIndex(ohI);
            individualActionIndices[agentI]=aThisAgent;
        }

        ja_i = GetInterfacePTPDiscretePure()->IndividualToJointActionIndices(
            individualActionIndices);

    }

    return(ja_i);
}